

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O1

long __thiscall CVmFileStream::get_len(CVmFileStream *this)

{
  CVmFile *pCVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pCVar1 = this->fp_;
  lVar4 = ftell((FILE *)pCVar1->fp_);
  lVar2 = pCVar1->seek_base_;
  fseek((FILE *)this->fp_->fp_,0,2);
  pCVar1 = this->fp_;
  lVar5 = ftell((FILE *)pCVar1->fp_);
  lVar3 = pCVar1->seek_base_;
  fseek((FILE *)this->fp_->fp_,(lVar4 - lVar2) + this->fp_->seek_base_,0);
  return lVar5 - lVar3;
}

Assistant:

long get_len()
    {
        /* remember the current seek position */
        long orig = fp_->get_pos();
        
        /* seek to the end of the file */
        fp_->set_pos_from_eof(0);

        /* the seek position is the file length */
        long len = fp_->get_pos();

        /* seek back to where we started */
        fp_->set_pos(orig);

        /* return the stream length */
        return len;
    }